

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O3

int __thiscall deqp::egl::PreservingSwapTests::init(PreservingSwapTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  deUint32 dVar6;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  TestCase *this_02;
  undefined1 uVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  uint uVar13;
  string name;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar4 = true;
  uVar7 = 1;
  do {
    this_00 = (TestCaseGroup *)operator_new(0x78);
    pcVar9 = "no_preserve";
    if (bVar4) {
      pcVar9 = "preserve";
    }
    TestCaseGroup::TestCaseGroup
              (this_00,(this->super_TestCaseGroup).m_eglTestCtx,pcVar9,
               glcts::fixed_sample_locations_values + 1);
    bVar3 = false;
    bVar5 = true;
    do {
      bVar12 = bVar5;
      this_01 = (TestCaseGroup *)operator_new(0x78);
      pcVar9 = "no_read_before_swap";
      if (bVar3) {
        pcVar9 = "read_before_swap";
      }
      TestCaseGroup::TestCaseGroup
                (this_01,(this->super_TestCaseGroup).m_eglTestCtx,pcVar9,
                 glcts::fixed_sample_locations_values + 1);
      lVar8 = 0;
      do {
        iVar1 = (&DAT_01b90e80)[lVar8];
        uVar13 = 0xffffffff;
        lVar11 = 0;
        do {
          if (!(bool)(~bVar4 & lVar11 == 0)) {
            iVar2 = *(int *)((long)&DAT_01b90e80 + lVar11);
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            if (iVar2 == 0 && iVar1 == 0) {
              lVar10 = 7;
              pcVar9 = "no_draw";
LAB_00e224ea:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,lVar10)
              ;
            }
            else {
              if (iVar1 == 2) {
                lVar10 = 10;
                pcVar9 = "pre_render";
LAB_00e2249e:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar9,lVar10);
              }
              else if (iVar1 == 1) {
                lVar10 = 9;
                pcVar9 = "pre_clear";
                goto LAB_00e2249e;
              }
              if ((uVar13 | (int)lVar8 - 1U) < 2) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
              }
              if (iVar2 == 2) {
                lVar10 = 0xb;
                pcVar9 = "post_render";
                goto LAB_00e224ea;
              }
              if (iVar2 == 1) {
                lVar10 = 10;
                pcVar9 = "post_clear";
                goto LAB_00e224ea;
              }
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            std::ios_base::~ios_base(local_138);
            this_02 = (TestCase *)operator_new(0x1ae8);
            TestCase::TestCase(this_02,(this->super_TestCaseGroup).m_eglTestCtx,(char *)local_1c8,
                               glcts::fixed_sample_locations_values + 1);
            (this_02->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__PreservingSwapTest_0210f3b8;
            dVar6 = deStringHash((char *)local_1c8);
            *(deUint32 *)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode = dVar6;
            *(undefined1 *)((long)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
                 uVar7;
            *(bool *)((long)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode + 5) = bVar3;
            *(int *)&this_02[1].super_TestCase.super_TestNode.m_testCtx = iVar1;
            *(int *)((long)&this_02[1].super_TestCase.super_TestNode.m_testCtx + 4) = iVar2;
            this_02[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
            this_02[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
            this_02[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
            this_02[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
            glw::Functions::Functions
                      ((Functions *)
                       &this_02[1].super_TestCase.super_TestNode.m_description._M_string_length);
            this_02[0x39].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&this_02[0x39].super_TestCase.super_TestNode.m_name.field_2 + 8) =
                 0;
            tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_02);
            if (local_1c8 != local_1b8) {
              operator_delete(local_1c8,local_1b8[0] + 1);
            }
          }
          uVar13 = uVar13 + 1;
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0xc);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_01);
      bVar3 = true;
      bVar5 = false;
    } while (bVar12);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    uVar7 = 0;
    bVar3 = !bVar4;
    bVar4 = false;
    if (bVar3) {
      return 0;
    }
  } while( true );
}

Assistant:

void PreservingSwapTests::init (void)
{
	const PreservingSwapTest::DrawType preSwapDrawTypes[] =
	{
		PreservingSwapTest::DRAWTYPE_NONE,
		PreservingSwapTest::DRAWTYPE_GLES2_CLEAR,
		PreservingSwapTest::DRAWTYPE_GLES2_RENDER
	};

	const PreservingSwapTest::DrawType postSwapDrawTypes[] =
	{
		PreservingSwapTest::DRAWTYPE_NONE,
		PreservingSwapTest::DRAWTYPE_GLES2_CLEAR,
		PreservingSwapTest::DRAWTYPE_GLES2_RENDER
	};

	for (int preserveNdx = 0; preserveNdx < 2; preserveNdx++)
	{
		const bool				preserve		= (preserveNdx == 0);
		TestCaseGroup* const	preserveGroup	= new TestCaseGroup(m_eglTestCtx, (preserve ? "preserve" : "no_preserve"), "");

		for (int readPixelsNdx = 0; readPixelsNdx < 2; readPixelsNdx++)
		{
			const bool				readPixelsBeforeSwap		= (readPixelsNdx == 1);
			TestCaseGroup* const	readPixelsBeforeSwapGroup	= new TestCaseGroup(m_eglTestCtx, (readPixelsBeforeSwap ? "read_before_swap" : "no_read_before_swap"), "");

			for (int preSwapDrawTypeNdx = 0; preSwapDrawTypeNdx < DE_LENGTH_OF_ARRAY(preSwapDrawTypes); preSwapDrawTypeNdx++)
			{
				const PreservingSwapTest::DrawType preSwapDrawType = preSwapDrawTypes[preSwapDrawTypeNdx];

				for (int postSwapDrawTypeNdx = 0; postSwapDrawTypeNdx < DE_LENGTH_OF_ARRAY(postSwapDrawTypes); postSwapDrawTypeNdx++)
				{
					const PreservingSwapTest::DrawType postSwapDrawType = postSwapDrawTypes[postSwapDrawTypeNdx];

					// If not preserving and rendering after swap, then there is nothing to verify
					if (!preserve && postSwapDrawType == PreservingSwapTest::DRAWTYPE_NONE)
						continue;

					const std::string name = generateTestName(preSwapDrawType, postSwapDrawType);

					readPixelsBeforeSwapGroup->addChild(new PreservingSwapTest(m_eglTestCtx, preserve, readPixelsBeforeSwap, preSwapDrawType, postSwapDrawType, name.c_str(), ""));
				}
			}

			preserveGroup->addChild(readPixelsBeforeSwapGroup);
		}

		addChild(preserveGroup);
	}
}